

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::my_merge_quads_to_grids(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  pointer *ppGVar1;
  uint uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  iterator __position;
  pointer pvVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong uVar13;
  GridMeshNode *pGVar14;
  RTCGeometry pRVar15;
  size_t sVar16;
  pointer puVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  long *plVar21;
  long *plVar22;
  size_type sVar23;
  undefined8 uVar24;
  long lVar25;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *this_00;
  size_t *psVar26;
  Vec3fa *pVVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  undefined2 uVar31;
  ulong uVar32;
  Vec3fa *pVVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  uint edge;
  GridMeshNode *local_298;
  long *local_290;
  RTCGeometry local_288;
  long *local_280;
  long *local_278;
  vector<bool,_std::allocator<bool>_> visited;
  avector<Vec3fa> local_240;
  Ref<embree::SceneGraph::Node> *local_220;
  Vec3fa *local_218;
  Ref<embree::SceneGraph::MaterialNode> local_210;
  Ref<embree::SceneGraph::Node> local_208;
  Ref<embree::SceneGraph::Node> local_200;
  Ref<embree::SceneGraph::Node> local_1f8;
  Node *local_1f0;
  deque<unsigned_int,_std::allocator<unsigned_int>_> left;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faces;
  ulong local_178;
  deque<unsigned_int,_std::allocator<unsigned_int>_> top;
  deque<unsigned_int,_std::allocator<unsigned_int>_> bottom;
  deque<unsigned_int,_std::allocator<unsigned_int>_> right;
  
  local_1f0 = (Node *)this;
  if (node->ptr == (Node *)0x0) {
    plVar21 = (long *)0x0;
  }
  else {
    plVar21 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  local_220 = node;
  if (plVar21 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      local_280 = (long *)0x0;
    }
    else {
      local_280 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_280 == (long *)0x0) {
      if (local_220->ptr == (Node *)0x0) {
        local_278 = (long *)0x0;
      }
      else {
        local_278 = (long *)__dynamic_cast(local_220->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_278 == (long *)0x0) {
        if (local_220->ptr == (Node *)0x0) {
          plVar22 = (long *)0x0;
        }
        else {
          plVar22 = (long *)__dynamic_cast(local_220->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0)
          ;
        }
        if (plVar22 != (long *)0x0) {
          local_290 = plVar22;
          (**(code **)(*plVar22 + 0x10))();
          local_298 = (GridMeshNode *)operator_new(0xa8);
          local_210.ptr = (MaterialNode *)local_290[0x1a];
          if (local_210.ptr != (MaterialNode *)0x0) {
            (*((local_210.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          pGVar14 = local_298;
          GridMeshNode::GridMeshNode
                    (local_298,&local_210,*(BBox1f *)(local_290 + 0xd),
                     local_290[0xf] - local_290[0xe] >> 5);
          (*(pGVar14->super_Node).super_RefCount._vptr_RefCount[2])(pGVar14);
          if (local_210.ptr != (MaterialNode *)0x0) {
            (*((local_210.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          sVar23 = (**(code **)(*local_290 + 0x70))();
          std::vector<bool,_std::allocator<bool>_>::resize(&visited,sVar23,false);
          if (((long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
              (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
            uVar39 = 0;
            do {
              uVar32 = uVar39 + 0x3f;
              if (-1 < (long)uVar39) {
                uVar32 = uVar39;
              }
              bVar8 = (byte)uVar39 & 0x3f;
              visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar32 >> 6) +
               ((ulong)((uVar39 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar32 >> 6) +
                    ((ulong)((uVar39 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                   (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              uVar39 = uVar39 + 1;
            } while (uVar39 < (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_offset +
                              ((long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_p -
                              (long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                              * 8);
          }
          sVar23 = (**(code **)(*local_290 + 0x70))();
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&faces,sVar23,(allocator_type *)&left);
          if (faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar39 = 0;
            do {
              faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar39] = 4;
              uVar39 = uVar39 + 1;
            } while (uVar39 < (ulong)((long)faces.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)faces.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
          local_288 = (RTCGeometry)rtcNewGeometry(g_device,8);
          puVar17 = faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar24 = (**(code **)(*local_290 + 0x70))();
          rtcSetSharedGeometryBuffer(local_288,0x10,0,0x5001,puVar17,0,4,uVar24);
          lVar28 = local_290[0x17];
          lVar25 = (**(code **)(*local_290 + 0x70))();
          rtcSetSharedGeometryBuffer(local_288,0,0,0x5001,lVar28,0,4,lVar25 << 2);
          rtcSetSharedGeometryBuffer
                    (local_288,1,0,0x9003,*(undefined8 *)(local_290[0xe] + 0x18),0,0x10,
                     *(undefined8 *)(local_290[0xe] + 8));
          rtcCommitGeometry(local_288);
          this_00 = &local_298->grids;
          uVar30 = 0;
          while( true ) {
            uVar39 = (**(code **)(*local_290 + 0x70))();
            pRVar15 = local_288;
            if (uVar39 <= uVar30) break;
            if ((visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p[uVar30 >> 6] >> ((ulong)uVar30 & 0x3f) & 1)
                == 0) {
              visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar30 >> 6] =
                   visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar30 >> 6] |
                   1L << ((byte)uVar30 & 0x3f);
              edge = rtcGetGeometryFirstHalfEdge(local_288);
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map_size = 0;
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                        ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&left,0);
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map_size = 0;
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                        ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&right,0);
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map_size = 0;
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                        ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&top,0);
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_map_size = 0;
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                        ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bottom,0);
              if (left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_int,std::allocator<unsigned_int>>::
                _M_push_back_aux<unsigned_int_const&>
                          ((deque<unsigned_int,std::allocator<unsigned_int>> *)&left,&edge);
              }
              else {
                *left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur = edge;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur =
                     left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur + 1;
              }
              edge = rtcGetGeometryNextHalfEdge(pRVar15,edge);
              if (bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_int,std::allocator<unsigned_int>>::
                _M_push_back_aux<unsigned_int_const&>
                          ((deque<unsigned_int,std::allocator<unsigned_int>> *)&bottom,&edge);
              }
              else {
                *bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur = edge;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur =
                     bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur + 1;
              }
              edge = rtcGetGeometryNextHalfEdge(pRVar15,edge);
              if (right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_int,std::allocator<unsigned_int>>::
                _M_push_back_aux<unsigned_int_const&>
                          ((deque<unsigned_int,std::allocator<unsigned_int>> *)&right,&edge);
              }
              else {
                *right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur = edge;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur =
                     right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur + 1;
              }
              edge = rtcGetGeometryNextHalfEdge(pRVar15,edge);
              if (top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<unsigned_int,std::allocator<unsigned_int>>::
                _M_push_back_aux<unsigned_int_const&>
                          ((deque<unsigned_int,std::allocator<unsigned_int>> *)&top,&edge);
              }
              else {
                *top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur = edge;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur =
                     top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur + 1;
              }
              edge = rtcGetGeometryNextHalfEdge(pRVar15,edge);
              uVar37 = 1;
              local_178 = 1;
              do {
                pRVar15 = local_288;
                bVar18 = extend_grid(local_288,&visited,&left,&top,&right);
                local_218 = (Vec3fa *)CONCAT71(local_218._1_7_,bVar18);
                bVar18 = extend_grid(pRVar15,&visited,&top,&right,&bottom);
                bVar19 = extend_grid(pRVar15,&visited,&right,&bottom,&left);
                bVar20 = extend_grid(pRVar15,&visited,&bottom,&left,&top);
                iVar38 = uVar37 + bVar18;
                uVar37 = iVar38 + (uint)bVar20;
                iVar34 = (int)local_178 + (uint)(byte)local_218;
                uVar2 = iVar34 + (uint)bVar19;
                local_178 = (ulong)uVar2;
                if (((byte)((bVar19 || bVar20) | (byte)local_218 | bVar18) != 1) ||
                   (0x7fff < (uint)bVar20 + iVar38 + 2)) break;
              } while ((uint)bVar19 + iVar34 + 2 < 0x8000);
              local_240._0_4_ =
                   *(undefined4 *)
                    &((local_298->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->size_active;
              iVar38 = uVar37 + 1;
              iVar34 = uVar2 + 1;
              uVar31 = (undefined2)iVar34;
              local_240.size_active._0_4_ = CONCAT22(uVar31,(short)iVar38);
              __position._M_current =
                   (local_298->grids).
                   super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_240._4_4_ = iVar38;
              if (__position._M_current ==
                  (local_298->grids).
                  super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
                          (this_00,__position,(Grid *)&local_240);
              }
              else {
                (__position._M_current)->resX = (short)iVar38;
                (__position._M_current)->resY = uVar31;
                (__position._M_current)->startVtx = local_240._0_4_;
                (__position._M_current)->lineStride = iVar38;
                ppGVar1 = &(local_298->grids).
                           super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppGVar1 = *ppGVar1 + 1;
              }
              if (local_290[0xf] != local_290[0xe]) {
                uVar32 = (ulong)(uint)(iVar38 * iVar34);
                uVar39 = 0;
                do {
                  pRVar15 = local_288;
                  plVar22 = local_290;
                  psVar26 = &local_240.size_active;
                  local_240.size_active = 0;
                  local_240.size_alloced = 0;
                  local_240.items = (Vec3fa *)0x0;
                  if (uVar32 != 0) {
                    local_240.items = (Vec3fa *)alignedMalloc(uVar32 << 4,0x10);
                    alignedFree((void *)0x0);
                    psVar26 = &local_240.size_alloced;
                    local_240.size_active = uVar32;
                  }
                  *psVar26 = uVar32;
                  gather_grid(pRVar15,&local_240,(ulong)uVar37,local_178,(uint *)plVar22[0x17],
                              (avector<Vec3fa> *)(plVar22[0xe] + uVar39 * 0x20),
                              *left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur);
                  sVar16 = local_240.size_active;
                  if (local_240.size_active != 0) {
                    uVar35 = 0;
                    local_218 = local_240.items;
                    pVVar33 = local_240.items;
                    do {
                      pvVar5 = (local_298->positions).
                               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      sVar6 = pvVar5[uVar39].size_active;
                      uVar7 = pvVar5[uVar39].size_alloced;
                      uVar29 = sVar6 + 1;
                      uVar36 = uVar7;
                      if ((uVar7 < uVar29) && (uVar36 = uVar29, uVar13 = uVar7, uVar7 != 0)) {
                        for (; uVar36 = uVar13, uVar13 < uVar29;
                            uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
                        }
                      }
                      pVVar27 = pVVar33 + uVar35;
                      fVar9 = (pVVar27->field_0).m128[0];
                      fVar10 = (pVVar27->field_0).m128[1];
                      fVar11 = (pVVar27->field_0).m128[2];
                      fVar12 = (pVVar27->field_0).m128[3];
                      if (uVar7 != uVar36) {
                        pVVar33 = pvVar5[uVar39].items;
                        pVVar27 = (Vec3fa *)alignedMalloc(uVar36 << 4,0x10);
                        pvVar5[uVar39].items = pVVar27;
                        if (pvVar5[uVar39].size_active != 0) {
                          lVar28 = 0;
                          uVar29 = 0;
                          do {
                            puVar4 = (undefined8 *)((long)&pVVar33->field_0 + lVar28);
                            uVar24 = puVar4[1];
                            puVar3 = (undefined8 *)((long)&(pvVar5[uVar39].items)->field_0 + lVar28)
                            ;
                            *puVar3 = *puVar4;
                            puVar3[1] = uVar24;
                            uVar29 = uVar29 + 1;
                            lVar28 = lVar28 + 0x10;
                          } while (uVar29 < pvVar5[uVar39].size_active);
                        }
                        alignedFree(pVVar33);
                        pvVar5[uVar39].size_active = sVar6;
                        pvVar5[uVar39].size_alloced = uVar36;
                        pVVar33 = local_218;
                      }
                      sVar6 = pvVar5[uVar39].size_active;
                      pvVar5[uVar39].size_active = sVar6 + 1;
                      pVVar27 = pvVar5[uVar39].items + sVar6;
                      (pVVar27->field_0).m128[0] = fVar9;
                      (pVVar27->field_0).m128[1] = fVar10;
                      (pVVar27->field_0).m128[2] = fVar11;
                      (pVVar27->field_0).m128[3] = fVar12;
                      uVar35 = uVar35 + 1;
                    } while (uVar35 != sVar16);
                  }
                  alignedFree(local_240.items);
                  local_240.size_active = 0;
                  local_240.size_alloced = 0;
                  local_240.items = (Vec3fa *)0x0;
                  uVar39 = uVar39 + 1;
                } while (uVar39 < (ulong)(local_290[0xf] - local_290[0xe] >> 5));
              }
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                        (&bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                        (&top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                        (&right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
              std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                        (&left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
            }
            uVar30 = uVar30 + 1;
          }
          rtcReleaseGeometry(local_288);
          (local_1f0->super_RefCount)._vptr_RefCount = (_func_int **)local_298;
          (*(local_298->super_Node).super_RefCount._vptr_RefCount[2])();
          if (faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
          (*(local_298->super_Node).super_RefCount._vptr_RefCount[3])();
          (**(code **)(*local_290 + 0x18))();
          if (local_278 != (long *)0x0) {
            (**(code **)(*local_278 + 0x18))();
          }
          if (local_280 != (long *)0x0) {
            (**(code **)(*local_280 + 0x18))();
          }
          bVar18 = false;
          goto LAB_0014f445;
        }
      }
      else {
        (**(code **)(*local_278 + 0x10))(local_278);
        lVar28 = local_278[0xd];
        if (local_278[0xe] != lVar28) {
          uVar39 = 0;
          do {
            local_208.ptr = *(Node **)(lVar28 + uVar39 * 8);
            if (local_208.ptr != (Node *)0x0) {
              (*((local_208.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            plVar22 = local_278;
            my_merge_quads_to_grids((SceneGraph *)&left,&local_208);
            lVar28 = plVar22[0xd];
            plVar22 = *(long **)(lVar28 + uVar39 * 8);
            if (plVar22 != (long *)0x0) {
              (**(code **)(*plVar22 + 0x18))();
            }
            *(_Map_pointer *)(lVar28 + uVar39 * 8) =
                 left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_map;
            left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            if (local_208.ptr != (Node *)0x0) {
              (*((local_208.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar39 = uVar39 + 1;
            lVar28 = local_278[0xd];
          } while (uVar39 < (ulong)(local_278[0xe] - lVar28 >> 3));
        }
      }
      if (local_278 != (long *)0x0) {
        (**(code **)(*local_278 + 0x18))();
      }
    }
    else {
      (**(code **)(*local_280 + 0x10))(local_280);
      local_200.ptr = (Node *)local_280[0x10];
      if (local_200.ptr != (Node *)0x0) {
        (*((local_200.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      my_merge_quads_to_grids((SceneGraph *)&left,&local_200);
      if ((long *)local_280[0x10] != (long *)0x0) {
        (**(code **)(*(long *)local_280[0x10] + 0x18))();
      }
      local_280[0x10] =
           (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_map;
      left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      if (local_200.ptr != (Node *)0x0) {
        (*((local_200.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar18 = true;
    if (local_280 != (long *)0x0) {
      (**(code **)(*local_280 + 0x18))();
    }
  }
  else {
    (**(code **)(*plVar21 + 0x10))(plVar21);
    local_1f8.ptr = (Node *)plVar21[0x13];
    if (local_1f8.ptr != (Node *)0x0) {
      (*((local_1f8.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    my_merge_quads_to_grids((SceneGraph *)&left,&local_1f8);
    if ((long *)plVar21[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar21[0x13] + 0x18))();
    }
    plVar21[0x13] =
         (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_map;
    left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    if (local_1f8.ptr != (Node *)0x0) {
      (*((local_1f8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar18 = true;
  }
LAB_0014f445:
  if (plVar21 != (long *)0x0) {
    (**(code **)(*plVar21 + 0x18))(plVar21);
  }
  if (bVar18) {
    (local_1f0->super_RefCount)._vptr_RefCount = (_func_int **)local_220->ptr;
    local_220->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)local_1f0;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::my_merge_quads_to_grids(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = my_merge_quads_to_grids(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,qmesh->numTimeSteps());
      
      std::vector<bool> visited;
      visited.resize(qmesh->numPrimitives());
      for (size_t i=0; i<visited.size(); i++) visited[i] = false;
      std::vector<unsigned int> faces(qmesh->numPrimitives());
      for (size_t i=0; i<faces.size(); i++) faces[i] = 4;

      /* create temporary subdiv mesh to get access to mesh topology */
      RTCGeometry geom = rtcNewGeometry(g_device,RTC_GEOMETRY_TYPE_SUBDIVISION);
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,   0, RTC_FORMAT_UINT,   faces.data(), 0, sizeof(unsigned int), qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX,  0, RTC_FORMAT_UINT,   qmesh->quads.data(), 0, sizeof(unsigned int), 4*qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, qmesh->positions[0].data(), 0, sizeof(Vec3fa), qmesh->numVertices());
      rtcCommitGeometry(geom);

      /* iterate over mesh and collect all grids */
      for (unsigned int i=0; i<qmesh->numPrimitives(); i++)
      {
        /* skip face if already added to some grid */
        if (visited[i]) continue;
        visited[i] = true;

        /* initialize grid with start quad */
        unsigned int edge = rtcGetGeometryFirstHalfEdge(geom,i);
        std::deque<unsigned int> left, right, top, bottom;
        left.push_back(edge);   edge = rtcGetGeometryNextHalfEdge(geom,edge);
        bottom.push_back(edge); edge = rtcGetGeometryNextHalfEdge(geom,edge);
        right.push_back(edge);  edge = rtcGetGeometryNextHalfEdge(geom,edge);
        top.push_back(edge);    edge = rtcGetGeometryNextHalfEdge(geom,edge);
        assert(edge == rtcGetGeometryFirstHalfEdge(geom,i));
        
        /* extend grid unless no longer possible */
        unsigned int width = 1;
        unsigned int height = 1;
        while (true)
        {
          const bool extended_top    = extend_grid(geom,visited,left,top,right);
          const bool extended_right  = extend_grid(geom,visited,top,right,bottom);
          const bool extended_bottom = extend_grid(geom,visited,right,bottom,left);
          const bool extended_left   = extend_grid(geom,visited,bottom,left,top);
          width  += extended_left + extended_right;
          height += extended_top  + extended_bottom;
          if (!extended_top && !extended_right && !extended_bottom && !extended_left) break;
          if (width+2  > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
          if (height+2 > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
        }
        
        /* add new grid to grid mesh */
        unsigned int startVertex = (unsigned int) gmesh->positions[0].size();
        gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVertex,width+1,width+1,height+1));

        /* gather all vertices of grid */
        for (size_t t=0; t<qmesh->numTimeSteps(); t++)
        {
          avector<Vec3fa> positions;
          positions.resize((width+1)*(height+1));
          gather_grid(geom,positions,width,height,(unsigned int*)qmesh->quads.data(), qmesh->positions[t], left.front());
          for (size_t i=0; i<positions.size(); i++)
            gmesh->positions[t].push_back(positions[i]);
        }
      }

      rtcReleaseGeometry(geom);

      return gmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }